

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::AggregateFunctionExtractor::ResultType
                  (Value *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  AggregateFunction local_140;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&local_140,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  FunctionStabilityToValue(__return_storage_ptr__,local_140.super_BaseScalarFunction.stability);
  AggregateFunction::~AggregateFunction(&local_140);
  return __return_storage_ptr__;
}

Assistant:

static Value ResultType(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		return FunctionStabilityToValue(entry.functions.GetFunctionByOffset(offset).stability);
	}